

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

int * Gia_ManTerCreateMap(Gia_ManTer_t *p,int fVerbose)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  int *__s;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj_00;
  uint local_44;
  uint local_40;
  int CounterE;
  int Counter0;
  int nFlopWords;
  int iRepr;
  int i;
  Vec_Int_t *vMapKtoI;
  Gia_Obj_t *pObj;
  int *pCi2Lit;
  int fVerbose_local;
  Gia_ManTer_t *p_local;
  
  local_40 = 0;
  local_44 = 0;
  iVar1 = Vec_PtrSize(p->vStates);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  pVVar4 = Gia_ManTerTranspose(p);
  p->vFlops = pVVar4;
  iVar2 = Gia_ManCiNum(p->pAig);
  __s = (int *)malloc((long)iVar2 << 2);
  iVar2 = Gia_ManCiNum(p->pAig);
  memset(__s,0xff,(long)iVar2 << 2);
  p_01 = Vec_IntAlloc(100);
  for (nFlopWords = 0; iVar2 = Gia_ManRegNum(p->pAig), nFlopWords < iVar2;
      nFlopWords = nFlopWords + 1) {
    iVar2 = p->pCount0[nFlopWords];
    iVar3 = Vec_PtrSize(p->vStates);
    if (iVar2 == iVar3) {
      iVar2 = Gia_ManPiNum(p->pAig);
      __s[iVar2 + nFlopWords] = 0;
      local_40 = local_40 + 1;
    }
    else if (p->pCountX[nFlopWords] == 0) {
      pVVar4 = p->vFlops;
      iVar2 = Vec_IntSize(p_01);
      iVar2 = Gia_ManFindEqualFlop(pVVar4,iVar2,iVar1);
      Vec_IntPush(p_01,nFlopWords);
      if (-1 < iVar2) {
        p_00 = p->pAig;
        iVar3 = Gia_ManPiNum(p->pAig);
        iVar2 = Vec_IntEntry(p_01,iVar2);
        pObj_00 = Gia_ManCi(p_00,iVar3 + iVar2);
        iVar2 = Gia_ObjId(p->pAig,pObj_00);
        iVar2 = Abc_Var2Lit(iVar2,0);
        iVar3 = Gia_ManPiNum(p->pAig);
        __s[iVar3 + nFlopWords] = iVar2;
        local_44 = local_44 + 1;
      }
    }
  }
  Vec_IntFree(p_01);
  if (fVerbose != 0) {
    printf("Transforming %d const and %d equiv registers.\n",(ulong)local_40,(ulong)local_44);
  }
  return __s;
}

Assistant:

int * Gia_ManTerCreateMap( Gia_ManTer_t * p, int fVerbose )
{
    int * pCi2Lit;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMapKtoI;
    int i, iRepr, nFlopWords, Counter0 = 0, CounterE = 0;
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    p->vFlops = Gia_ManTerTranspose( p );
    pCi2Lit = ABC_FALLOC( int, Gia_ManCiNum(p->pAig) );
    vMapKtoI = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) )
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = 0, Counter0++;
        else if ( p->pCountX[i] == 0 )
        {
            iRepr = Gia_ManFindEqualFlop( p->vFlops, Vec_IntSize(vMapKtoI), nFlopWords );
            Vec_IntPush( vMapKtoI, i );
            if ( iRepr < 0 )
                continue;
            pObj = Gia_ManCi( p->pAig, Gia_ManPiNum(p->pAig)+Vec_IntEntry(vMapKtoI, iRepr) );
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = Abc_Var2Lit( Gia_ObjId( p->pAig, pObj ), 0 );
            CounterE++;
        }
    Vec_IntFree( vMapKtoI );
    if ( fVerbose )
        printf( "Transforming %d const and %d equiv registers.\n", Counter0, CounterE );
    return pCi2Lit;
}